

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O0

void copy_area(int *src,int src_stride,int *dst,int dst_stride,int width,int height)

{
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  void *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined4 local_24;
  undefined8 local_18;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_24 = in_R9D; local_24 != 0; local_24 = local_24 + -1) {
    memcpy(local_18,local_8,(long)in_R8D << 2);
    local_8 = (void *)((long)local_8 + (long)in_ESI * 4);
    local_18 = (void *)((long)local_18 + (long)in_ECX * 4);
  }
  return;
}

Assistant:

static void copy_area(int *src, int src_stride, int *dst, int dst_stride,
                      int width, int height) {
  while (height) {
    memcpy(dst, src, width * sizeof(*src));
    src += src_stride;
    dst += dst_stride;
    --height;
  }
  return;
}